

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# CustomExternalWrapperObject.cpp
# Opt level: O0

JavascriptString * __thiscall
Js::CustomExternalWrapperObject::GetEnumerator::WrapperOwnKeysEnumerator::MoveAndGetNext
          (WrapperOwnKeysEnumerator *this,PropertyId *propertyId,PropertyAttributes *attributes)

{
  ScriptContext *scriptContext;
  undefined8 value;
  bool bVar1;
  uint32 uVar2;
  int iVar3;
  charcount_t len_00;
  JavascriptArray **ppJVar4;
  JavascriptArray *pJVar5;
  undefined4 extraout_var;
  CustomExternalWrapperObject **ppCVar6;
  char16 *string;
  BaseHashSet<JsUtil::CharacterBuffer<char16_t>,_Memory::Recycler,_DictionarySizePolicy<PowerOf2Policy,_2U,_2U,_1U,_4U>,_JsUtil::CharacterBuffer<char16_t>,_DefaultComparer,_JsUtil::SimpleHashedEntry,_JsUtil::NoResizeLock>
  *pBVar7;
  ScriptContext *objectScriptContext;
  Var pvVar8;
  undefined1 local_88 [8];
  CharacterBuffer<char16_t> propertyString;
  undefined1 local_70 [4];
  BOOL ret;
  PropertyDescriptor desc;
  JavascriptString *propertyName;
  Var var;
  uint32 len;
  PropertyAttributes *attributes_local;
  PropertyId *propertyId_local;
  WrapperOwnKeysEnumerator *this_local;
  
  *propertyId = -1;
  if (attributes != (PropertyAttributes *)0x0) {
    *attributes = '\x01';
  }
  ppJVar4 = Memory::WriteBarrierPtr::operator_cast_to_JavascriptArray__
                      ((WriteBarrierPtr *)&this->trapResult);
  if (*ppJVar4 == (JavascriptArray *)0x0) {
LAB_0106434f:
    this_local = (WrapperOwnKeysEnumerator *)0x0;
  }
  else {
    pJVar5 = Memory::WriteBarrierPtr<Js::JavascriptArray>::operator->(&this->trapResult);
    uVar2 = ArrayObject::GetLength(&pJVar5->super_ArrayObject);
    do {
      do {
        do {
          do {
            if (uVar2 <= this->index) goto LAB_0106434f;
            pJVar5 = Memory::WriteBarrierPtr<Js::JavascriptArray>::operator->(&this->trapResult);
            this->index = this->index + 1;
            iVar3 = (*(pJVar5->super_ArrayObject).super_DynamicObject.super_RecyclableObject.
                      super_FinalizableObject.super_IRecyclerVisitedObject.
                      _vptr_IRecyclerVisitedObject[0x72])();
            pvVar8 = (Var)CONCAT44(extraout_var,iVar3);
          } while ((pvVar8 == (Var)0x0) || (bVar1 = VarIs<Js::JavascriptString>(pvVar8), !bVar1));
          desc._40_8_ = VarTo<Js::JavascriptString>(pvVar8);
          PropertyDescriptor::PropertyDescriptor((PropertyDescriptor *)local_70);
          ppCVar6 = Memory::WriteBarrierPtr::operator_cast_to_CustomExternalWrapperObject__
                              ((WriteBarrierPtr *)&this->wrapper);
          propertyString._12_4_ =
               Js::JavascriptOperators::GetOwnPropertyDescriptor
                         ((RecyclableObject *)*ppCVar6,(JavascriptString *)desc._40_8_,
                          this->scriptContext,(PropertyDescriptor *)local_70);
          string = JavascriptString::GetString((JavascriptString *)desc._40_8_);
          len_00 = JavascriptString::GetLength((JavascriptString *)desc._40_8_);
          JsUtil::CharacterBuffer<char16_t>::CharacterBuffer
                    ((CharacterBuffer<char16_t> *)local_88,string,len_00);
        } while (propertyString._12_4_ == 0);
        pBVar7 = Memory::
                 WriteBarrierPtr<JsUtil::BaseHashSet<JsUtil::CharacterBuffer<char16_t>,_Memory::Recycler,_DictionarySizePolicy<PowerOf2Policy,_2U,_2U,_1U,_4U>,_JsUtil::CharacterBuffer<char16_t>,_DefaultComparer,_JsUtil::SimpleHashedEntry,_JsUtil::NoResizeLock>_>
                 ::operator->(&this->visited);
        bVar1 = JsUtil::
                BaseHashSet<JsUtil::CharacterBuffer<char16_t>,_Memory::Recycler,_DictionarySizePolicy<PowerOf2Policy,_2U,_2U,_1U,_4U>,_JsUtil::CharacterBuffer<char16_t>,_DefaultComparer,_JsUtil::SimpleHashedEntry,_JsUtil::NoResizeLock>
                ::Contains(pBVar7,(CharacterBuffer<char16_t> *)local_88);
      } while (bVar1);
      pBVar7 = Memory::
               WriteBarrierPtr<JsUtil::BaseHashSet<JsUtil::CharacterBuffer<char16_t>,_Memory::Recycler,_DictionarySizePolicy<PowerOf2Policy,_2U,_2U,_1U,_4U>,_JsUtil::CharacterBuffer<char16_t>,_DefaultComparer,_JsUtil::SimpleHashedEntry,_JsUtil::NoResizeLock>_>
               ::operator->(&this->visited);
      JsUtil::
      BaseHashSet<JsUtil::CharacterBuffer<char16_t>,_Memory::Recycler,_DictionarySizePolicy<PowerOf2Policy,_2U,_2U,_1U,_4U>,_JsUtil::CharacterBuffer<char16_t>,_DefaultComparer,_JsUtil::SimpleHashedEntry,_JsUtil::NoResizeLock>
      ::Add(pBVar7,(CharacterBuffer<char16_t> *)local_88);
      bVar1 = PropertyDescriptor::IsEnumerable((PropertyDescriptor *)local_70);
      value = desc._40_8_;
    } while (!bVar1);
    scriptContext = this->scriptContext;
    objectScriptContext = RecyclableObject::GetScriptContext((RecyclableObject *)desc._40_8_);
    pvVar8 = CrossSite::MarshalVar(scriptContext,(Var)value,objectScriptContext);
    this_local = (WrapperOwnKeysEnumerator *)VarTo<Js::JavascriptString>(pvVar8);
  }
  return (JavascriptString *)this_local;
}

Assistant:

virtual JavascriptString * MoveAndGetNext(PropertyId& propertyId, PropertyAttributes* attributes = nullptr) override
        {
            propertyId = Constants::NoProperty;
            if (attributes != nullptr)
            {
                *attributes = PropertyEnumerable;
            }
            // 13.7.5.15 EnumerateObjectProperties(O) (https://tc39.github.io/ecma262/#sec-enumerate-object-properties)
            // for (let key of Reflect.ownKeys(obj)) {
            if (trapResult != nullptr)
            {
                uint32 len = trapResult->GetLength();
                while (index < len)
                {
                    Var var = trapResult->DirectGetItem(index++);
                    if (var)
                    {
                        // if (typeof key === "string") {
                        if (VarIs<JavascriptString>(var))
                        {
                            JavascriptString* propertyName = VarTo<JavascriptString>(var);
                            // let desc = Reflect.getOwnPropertyDescriptor(obj, key);
                            Js::PropertyDescriptor desc;
                            BOOL ret = JavascriptOperators::GetOwnPropertyDescriptor(wrapper, propertyName, scriptContext, &desc);
                            const JsUtil::CharacterBuffer<WCHAR> propertyString(propertyName->GetString(), propertyName->GetLength());
                            // if (desc && !visited.has(key)) {
                            if (ret && !visited->Contains(propertyString))
                            {
                                visited->Add(propertyString);
                                // if (desc.enumerable) yield key;
                                if (desc.IsEnumerable())
                                {
                                    //TODO: (vsadov) not sure if should marshal here, it is "getting"
                                    return VarTo<JavascriptString>(CrossSite::MarshalVar(
                                        scriptContext, propertyName, propertyName->GetScriptContext()));
                                }
                            }
                        }
                    }
                }
            }
            return nullptr;
        }